

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O0

void __thiscall Webcam::~Webcam(Webcam *this)

{
  Webcam *this_local;
  
  if ((this->isOpen & 1U) != 0) {
    stop(this);
    stop_capturing();
    uninit_device();
    close_device();
  }
  return;
}

Assistant:

Webcam::~Webcam()
{
    if(isOpen) {
        stop();
        stop_capturing ();
        uninit_device ();
        close_device ();
    }
}